

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side3_6d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar23;
  double dVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar38;
  undefined1 auVar37 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar62;
  undefined1 auVar61 [16];
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  
  dVar14 = p0[2];
  dVar18 = p1[2] - dVar14;
  dVar57 = p0[3];
  dVar63 = p1[3] - dVar57;
  dVar54 = p0[4];
  dVar39 = p1[4] - dVar54;
  dVar45 = p0[5];
  dVar67 = p1[5] - dVar45;
  dVar32 = *p0;
  dVar65 = p0[1];
  dVar29 = *p1 - dVar32;
  dVar42 = p1[1] - dVar65;
  dVar15 = ABS(dVar18);
  if (ABS(dVar18) <= ABS(dVar29)) {
    dVar15 = ABS(dVar29);
  }
  dVar24 = ABS(dVar42);
  if (ABS(dVar42) <= dVar15) {
    dVar24 = dVar15;
  }
  dVar15 = ABS(dVar63);
  if (ABS(dVar63) <= dVar24) {
    dVar15 = dVar24;
  }
  dVar24 = ABS(dVar39);
  if (ABS(dVar39) <= dVar15) {
    dVar24 = dVar15;
  }
  dVar56 = *q0 - dVar32;
  dVar58 = q0[1] - dVar65;
  dVar15 = ABS(dVar67);
  if (ABS(dVar67) <= dVar24) {
    dVar15 = dVar24;
  }
  dVar24 = ABS(dVar58);
  if (ABS(dVar58) <= ABS(dVar56)) {
    dVar24 = ABS(dVar56);
  }
  dVar8 = q0[2] - dVar14;
  dVar31 = ABS(dVar8);
  if (ABS(dVar8) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar19 = q0[3] - dVar57;
  dVar24 = ABS(dVar19);
  if (ABS(dVar19) <= dVar31) {
    dVar24 = dVar31;
  }
  dVar9 = q0[4] - dVar54;
  dVar31 = ABS(dVar9);
  if (ABS(dVar9) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar51 = q0[5] - dVar45;
  dVar24 = ABS(dVar51);
  if (ABS(dVar51) <= dVar31) {
    dVar24 = dVar31;
  }
  dVar53 = *q1 - dVar32;
  dVar31 = ABS(dVar53);
  if (ABS(dVar53) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar20 = q1[1] - dVar65;
  dVar24 = ABS(dVar20);
  if (ABS(dVar20) <= dVar31) {
    dVar24 = dVar31;
  }
  dVar10 = q1[2] - dVar14;
  dVar31 = ABS(dVar10);
  if (ABS(dVar10) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar21 = q1[3] - dVar57;
  dVar24 = ABS(dVar21);
  if (ABS(dVar21) <= dVar31) {
    dVar24 = dVar31;
  }
  dVar11 = q1[4] - dVar54;
  dVar31 = ABS(dVar11);
  if (ABS(dVar11) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar43 = q1[5] - dVar45;
  dVar24 = ABS(dVar43);
  if (ABS(dVar43) <= dVar31) {
    dVar24 = dVar31;
  }
  dVar12 = *q2 - dVar32;
  dVar31 = ABS(dVar12);
  if (ABS(dVar12) <= dVar24) {
    dVar31 = dVar24;
  }
  dVar22 = *p2 - dVar32;
  auVar25._0_8_ = ABS(dVar22);
  auVar25._8_8_ = dVar31;
  dVar30 = p2[1] - dVar65;
  dVar33 = q2[1] - dVar65;
  auVar27._0_8_ = ABS(dVar30);
  auVar27._8_8_ = ABS(dVar33);
  auVar16 = maxpd(auVar27,auVar25);
  dVar59 = p2[2] - dVar14;
  dVar62 = q2[2] - dVar14;
  auVar61._0_8_ = ABS(dVar59);
  auVar61._8_8_ = ABS(dVar62);
  auVar16 = maxpd(auVar61,auVar16);
  dVar23 = p2[4] - dVar54;
  dVar28 = q2[4] - dVar54;
  dVar34 = p2[5] - dVar45;
  dVar38 = q2[5] - dVar45;
  dVar13 = p2[3] - dVar57;
  dVar46 = q2[3] - dVar57;
  auVar17._0_8_ = ABS(dVar13);
  auVar17._8_8_ = ABS(dVar46);
  auVar16 = maxpd(auVar17,auVar16);
  auVar26._0_8_ = ABS(dVar23);
  auVar26._8_8_ = ABS(dVar28);
  auVar27 = maxpd(auVar26,auVar16);
  auVar16._0_8_ = ABS(dVar34);
  auVar16._8_8_ = ABS(dVar38);
  auVar16 = maxpd(auVar16,auVar27);
  dVar6 = auVar16._0_8_;
  dVar7 = auVar16._8_8_;
  dVar24 = dVar6;
  dVar31 = dVar15;
  if ((dVar15 <= dVar6) && (dVar24 = dVar15, dVar15 < dVar6)) {
    dVar31 = dVar6;
  }
  dVar35 = dVar7;
  if ((dVar24 <= dVar7) && (dVar35 = dVar24, dVar31 < dVar7)) {
    dVar31 = dVar7;
  }
  iVar5 = 0;
  iVar4 = 0;
  if ((1.4995850219305951e-74 <= dVar35) && (iVar4 = iVar5, dVar31 <= 1.2980742146337065e+33)) {
    dVar66 = dVar67 * dVar51 +
             dVar39 * dVar9 + dVar63 * dVar19 + dVar18 * dVar8 + dVar29 * dVar56 + dVar42 * dVar58;
    dVar64 = dVar67 * dVar43 +
             dVar39 * dVar11 + dVar63 * dVar21 + dVar18 * dVar10 + dVar29 * dVar53 + dVar42 * dVar20
    ;
    dVar50 = dVar67 * dVar38 +
             dVar39 * dVar28 + dVar63 * dVar46 + dVar18 * dVar62 + dVar29 * dVar12 + dVar42 * dVar33
    ;
    dVar24 = dVar34 * dVar51 +
             dVar23 * dVar9 + dVar13 * dVar19 + dVar59 * dVar8 + dVar22 * dVar56 + dVar30 * dVar58;
    dVar44 = dVar34 * dVar43 +
             dVar23 * dVar11 + dVar13 * dVar21 + dVar59 * dVar10 + dVar22 * dVar53 + dVar30 * dVar20
    ;
    dVar52 = dVar34 * dVar38 +
             dVar23 * dVar28 + dVar13 * dVar46 + dVar59 * dVar62 + dVar22 * dVar12 + dVar30 * dVar33
    ;
    dVar66 = dVar66 + dVar66;
    dVar64 = dVar64 + dVar64;
    dVar50 = dVar50 + dVar50;
    dVar24 = dVar24 + dVar24;
    dVar44 = dVar44 + dVar44;
    dVar52 = dVar52 + dVar52;
    dVar47 = dVar64 * dVar52 - dVar44 * dVar50;
    dVar40 = dVar50 * dVar24 - dVar52 * dVar66;
    dVar31 = dVar66 * dVar44 - dVar24 * dVar64;
    dVar60 = dVar47 + dVar40 + dVar31;
    dVar35 = dVar15 * dVar7 * dVar6 * dVar7 * 4.400074760265839e-13;
    iVar5 = 1;
    if ((dVar35 < dVar60) || (iVar5 = -1, dVar60 < -dVar35)) {
      dVar32 = *p3 - dVar32;
      dVar65 = p3[1] - dVar65;
      dVar14 = p3[2] - dVar14;
      dVar57 = p3[3] - dVar57;
      dVar54 = p3[4] - dVar54;
      dVar45 = p3[5] - dVar45;
      dVar35 = ABS(dVar65);
      if (ABS(dVar65) <= dVar15) {
        dVar35 = dVar15;
      }
      dVar41 = ABS(dVar14);
      if (ABS(dVar14) <= dVar35) {
        dVar41 = dVar35;
      }
      dVar35 = ABS(dVar32);
      if (ABS(dVar32) <= dVar41) {
        dVar35 = dVar41;
      }
      dVar41 = ABS(dVar57);
      if (ABS(dVar57) <= dVar35) {
        dVar41 = dVar35;
      }
      dVar35 = ABS(dVar54);
      if (ABS(dVar54) <= dVar41) {
        dVar35 = dVar41;
      }
      dVar41 = ABS(dVar45);
      if (ABS(dVar45) <= dVar35) {
        dVar41 = dVar35;
      }
      auVar1._8_8_ = dVar15;
      auVar1._0_8_ = dVar15;
      auVar27 = maxpd(auVar16,auVar1);
      auVar37._8_8_ = dVar41;
      auVar37._0_8_ = dVar7;
      auVar16 = maxpd(auVar37,auVar27);
      dVar35 = auVar27._8_8_;
      auVar48._8_8_ = dVar35;
      auVar48._0_8_ = dVar41;
      auVar16 = maxpd(auVar48,auVar16);
      dVar49 = auVar16._8_8_;
      dVar15 = dVar49;
      if (dVar49 <= auVar16._0_8_) {
        dVar15 = auVar16._0_8_;
      }
      dVar2 = dVar35;
      if (dVar35 <= dVar15) {
        dVar2 = dVar15;
      }
      dVar15 = dVar7;
      if (dVar6 <= dVar7) {
        dVar15 = dVar6;
      }
      dVar55 = dVar2;
      dVar36 = dVar6;
      if ((dVar15 <= dVar2) && (dVar55 = dVar15, dVar6 < dVar2)) {
        dVar36 = dVar2;
      }
      dVar15 = dVar41;
      if (dVar55 <= dVar41) {
        dVar15 = dVar55;
      }
      dVar55 = dVar49;
      if (dVar15 <= dVar49) {
        dVar55 = dVar15;
      }
      dVar15 = dVar35;
      if (dVar55 <= dVar35) {
        dVar15 = dVar55;
      }
      if ((3.31864264949884e-50 <= dVar15) && (dVar36 <= 1.2980742146337065e+33)) {
        dVar15 = dVar67 * dVar67 +
                 dVar39 * dVar39 +
                 dVar63 * dVar63 + dVar18 * dVar18 + dVar29 * dVar29 + dVar42 * dVar42;
        dVar63 = dVar34 * dVar34 +
                 dVar23 * dVar23 +
                 dVar13 * dVar13 + dVar59 * dVar59 + dVar22 * dVar22 + dVar30 * dVar30;
        dVar29 = dVar51 * dVar45 +
                 dVar9 * dVar54 +
                 dVar19 * dVar57 + dVar8 * dVar14 + dVar56 * dVar32 + dVar58 * dVar65;
        dVar42 = dVar43 * dVar45 +
                 dVar11 * dVar54 +
                 dVar21 * dVar57 + dVar10 * dVar14 + dVar53 * dVar32 + dVar20 * dVar65;
        dVar39 = dVar38 * dVar45 +
                 dVar28 * dVar54 +
                 dVar46 * dVar57 + dVar62 * dVar14 + dVar12 * dVar32 + dVar33 * dVar65;
        dVar18 = dVar41 * dVar7 * dVar6 * dVar35 * dVar49 * dVar2 * 1.665641335871132e-11;
        dVar14 = dVar60 * (dVar45 * dVar45 +
                          dVar54 * dVar54 +
                          dVar57 * dVar57 + dVar14 * dVar14 + dVar32 * dVar32 + dVar65 * dVar65) -
                 ((dVar31 + (dVar24 - dVar44) * dVar15 + (dVar64 - dVar66) * dVar63) *
                  (dVar39 + dVar39) +
                 (dVar40 + (dVar52 - dVar24) * dVar15 + (dVar66 - dVar50) * dVar63) *
                 (dVar42 + dVar42) +
                 (dVar47 + (dVar44 - dVar52) * dVar15 + (dVar50 - dVar64) * dVar63) *
                 (dVar29 + dVar29));
        iVar3 = 1;
        if ((dVar18 < dVar14) || (iVar3 = -1, dVar14 < -dVar18)) {
          iVar4 = iVar3 * iVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

inline int side3_6d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double l1;
    l1 = (1 * ((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double l2;
    l2 = (1 * ((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double l3;
    l3 = (1 * ((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double a10;
    a10 = (2 * ((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double a11;
    a11 = (2 * ((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double a12;
    a12 = (2 * ((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)));
    double a20;
    a20 = (2 * ((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)));
    double a21;
    a21 = (2 * ((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)));
    double a22;
    a22 = (2 * ((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)));
    double a30;
    a30 = (2 * ((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)));
    double a31;
    a31 = (2 * ((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)));
    double a32;
    a32 = (2 * ((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.49958502193059513986e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.40007476026583916019e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    double max6 = max1;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max6 < max7) )
    {
        max6 = max7;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 3.31864264949884013629e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66564133587113197628e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}